

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

NodeRef * __thiscall
c4::yml::Tree::operator[](NodeRef *__return_storage_ptr__,Tree *this,csubstr key)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  size_t sVar5;
  NodeRef *pNVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  byte bVar13;
  csubstr cVar14;
  char *pcStack_98;
  size_t local_90;
  csubstr local_88;
  char msg [68];
  
  sVar8 = key.len;
  pcVar11 = key.str;
  bVar13 = 0;
  sVar5 = root_id(this);
  local_88.str = pcVar11;
  local_88.len = sVar8;
  if (sVar5 == 0xffffffffffffffff) {
    pcVar10 = "check failed: (((ConstImpl const* __restrict__)this)->m_id != NONE)";
    pcVar12 = msg;
    for (lVar9 = 0x44; lVar9 != 0; lVar9 = lVar9 + -1) {
      *pcVar12 = *pcVar10;
      pcVar10 = pcVar10 + (ulong)bVar13 * -2 + 1;
      pcVar12 = pcVar12 + (ulong)bVar13 * -2 + 1;
    }
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar2 = (code *)swi(3);
      pNVar6 = (NodeRef *)(*pcVar2)();
      return pNVar6;
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar14 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_90 = cVar14.len;
    pcStack_98 = cVar14.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x50b2) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x50b2) << 0x40,8);
    LVar3.name.str = pcStack_98;
    LVar3.name.len = local_90;
    (*p_Var1)(msg,0x44,LVar3,(this->m_callbacks).m_user_data);
  }
  sVar7 = find_child(this,sVar5,&local_88);
  pcVar10 = (char *)0x0;
  bVar4 = sVar7 == 0xffffffffffffffff;
  if (bVar4) {
    pcVar10 = pcVar11;
    sVar7 = sVar5;
  }
  sVar5 = 0xffffffffffffffff;
  if (bVar4) {
    sVar5 = sVar8;
  }
  __return_storage_ptr__->m_tree = this;
  __return_storage_ptr__->m_id = sVar7;
  (__return_storage_ptr__->m_seed).str = pcVar10;
  (__return_storage_ptr__->m_seed).len = sVar5;
  return __return_storage_ptr__;
}

Assistant:

NodeRef Tree::operator[] (csubstr key)
{
    return rootref()[key];
}